

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_hmac.c
# Opt level: O0

int tc_hmac_set_key(TCHmacState_t ctx,uint8_t *key,uint key_size)

{
  long lVar1;
  uint8_t *data;
  undefined8 uStack_140;
  uint8_t auStack_138 [8];
  uint8_t *local_130;
  undefined1 local_128 [8];
  tc_hmac_state_struct dummy_state;
  unsigned_long __vla_expr0;
  uint key_size_local;
  uint8_t *key_local;
  TCHmacState_t ctx_local;
  
  if (((ctx == (TCHmacState_t)0x0) || (key == (uint8_t *)0x0)) || (key_size == 0)) {
    ctx_local._4_4_ = 0;
  }
  else {
    dummy_state.key._120_8_ = ZEXT48(key_size);
    lVar1 = -(dummy_state.key._120_8_ + 0xf & 0xfffffffffffffff0);
    local_130 = auStack_138 + lVar1;
    if (key_size < 0x41) {
      *(undefined8 *)((long)&uStack_140 + lVar1) = 0x10c511;
      tc_sha256_init((TCSha256State_t)local_128);
      data = local_130;
      *(undefined8 *)((long)&uStack_140 + lVar1) = 0x10c529;
      tc_sha256_update((TCSha256State_t)local_128,data,(ulong)key_size);
      *(undefined8 *)((long)&uStack_140 + lVar1) = 0x10c544;
      tc_sha256_final(dummy_state.key + 0x18,(TCSha256State_t)local_128);
      *(undefined8 *)((long)&uStack_140 + lVar1) = 0x10c558;
      rekey(ctx->key,key,key_size);
    }
    else {
      *(undefined8 *)((long)&uStack_140 + lVar1) = 0x10c563;
      tc_sha256_init(&ctx->hash_state);
      *(undefined8 *)((long)&uStack_140 + lVar1) = 0x10c575;
      tc_sha256_update(&ctx->hash_state,key,(ulong)key_size);
      *(undefined8 *)((long)&uStack_140 + lVar1) = 0x10c58a;
      tc_sha256_final(ctx->key + 0x20,&ctx->hash_state);
      *(undefined8 *)((long)&uStack_140 + lVar1) = 0x10c5a8;
      rekey(ctx->key,ctx->key + 0x20,0x20);
    }
    ctx_local._4_4_ = 1;
  }
  return ctx_local._4_4_;
}

Assistant:

int tc_hmac_set_key(TCHmacState_t ctx, const uint8_t *key,
		    unsigned int key_size)
{

	/* input sanity check: */
	if (ctx == (TCHmacState_t) 0 ||
	    key == (const uint8_t *) 0 ||
	    key_size == 0) {
		return TC_CRYPTO_FAIL;
	}

	const uint8_t dummy_key[key_size];
	struct tc_hmac_state_struct dummy_state;

	if (key_size <= TC_SHA256_BLOCK_SIZE) {
		/*
		 * The next three lines consist of dummy calls just to avoid
		 * certain timing attacks. Without these dummy calls,
		 * adversaries would be able to learn whether the key_size is
		 * greater than TC_SHA256_BLOCK_SIZE by measuring the time
		 * consumed in this process.
		 */
		(void)tc_sha256_init(&dummy_state.hash_state);
		(void)tc_sha256_update(&dummy_state.hash_state,
				       dummy_key,
				       key_size);
		(void)tc_sha256_final(&dummy_state.key[TC_SHA256_DIGEST_SIZE],
				      &dummy_state.hash_state);

		/* Actual code for when key_size <= TC_SHA256_BLOCK_SIZE: */
		rekey(ctx->key, key, key_size);
	} else {
		(void)tc_sha256_init(&ctx->hash_state);
		(void)tc_sha256_update(&ctx->hash_state, key, key_size);
		(void)tc_sha256_final(&ctx->key[TC_SHA256_DIGEST_SIZE],
				      &ctx->hash_state);
		rekey(ctx->key,
		      &ctx->key[TC_SHA256_DIGEST_SIZE],
		      TC_SHA256_DIGEST_SIZE);
	}

	return TC_CRYPTO_SUCCESS;
}